

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

char * StringToUnicode(char *cc,int size)

{
  uint codepoint;
  char *pcVar1;
  byte *pbVar2;
  int local_34;
  int local_30;
  int i;
  int count1;
  int count;
  char *c;
  int ch;
  int size_local;
  char *cc_local;
  
  i = 0;
  local_30 = 0;
  _count1 = (byte *)cc;
  c._4_4_ = size;
  _ch = (byte *)cc;
  TArray<char,_char>::Clear(&out);
  do {
    pbVar2 = _count1 + 1;
    c._0_4_ = (uint)*_count1;
    _count1 = pbVar2;
    if ((uint)c == 0) break;
    local_30 = local_30 + 1;
    if ((uint)c < 0x80) {
      i = i + 1;
    }
    else if ((uint)c < 0x800) {
      i = i + 2;
    }
    else {
      i = i + 3;
    }
  } while ((local_30 != c._4_4_) || (c._4_4_ < 1));
  if (i == local_30) {
    cc_local = (char *)_ch;
  }
  else {
    TArray<char,_char>::Resize(&out,i + 1);
    pcVar1 = TArray<char,_char>::Last(&out);
    *pcVar1 = '\0';
    _count1 = _ch;
    local_34 = 0;
    while( true ) {
      codepoint = (uint)*_count1;
      c._0_4_ = codepoint;
      if (codepoint == 0) break;
      _count1 = _count1 + 1;
      pcVar1 = TArray<char,_char>::operator[](&out,(long)local_34);
      utf8_encode(codepoint,pcVar1,&local_30);
      local_34 = local_30 + local_34;
    }
    _count1 = _count1 + 1;
    cc_local = TArray<char,_char>::operator[](&out,0);
  }
  return cc_local;
}

Assistant:

static const char *StringToUnicode(const char *cc, int size = -1)
{
	int ch;
	const char *c = cc;
	int count = 0;
	int count1 = 0;
	out.Clear();
	while ((ch = (*c++) & 255))
	{
		count1++;
		if (ch >= 128)
		{
			if (ch < 0x800) count += 2;
			else count += 3;
			// The source cannot contain 4-byte chars.
		}
		else count++;
		if (count1 == size && size > 0) break;
	}
	if (count == count1) return cc;	// string is pure ASCII.
	// we need to convert
	out.Resize(count + 1);
	out.Last() = 0;
	c = cc;
	int i = 0;
	while ((ch = (*c++) & 255))
	{
		utf8_encode(ch, &out[i], &count1);
		i += count1;
	}
	return &out[0];
}